

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O1

SeatPromptResult * console_get_userpass_input(SeatPromptResult *__return_storage_ptr__,prompts_t *p)

{
  char *pcVar1;
  prompt_t *ppVar2;
  size_t sVar3;
  _Bool _Var4;
  bool bVar5;
  int __fd;
  uint uVar6;
  FILE *__s;
  size_t sVar7;
  void *__buf;
  ssize_t sVar8;
  int *piVar9;
  int __fd_00;
  ulong uVar10;
  bool bVar11;
  ptrlen whole;
  ptrlen whole_00;
  ptrlen suffix;
  ptrlen suffix_00;
  termios newmode;
  termios oldmode;
  termios local_a8;
  termios local_6c;
  
  if (p->n_prompts == 0) {
    bVar11 = true;
  }
  else {
    uVar10 = 0;
    do {
      prompt_set_result(p->prompts[uVar10],"");
      uVar10 = uVar10 + 1;
    } while (uVar10 < p->n_prompts);
    bVar11 = p->n_prompts == 0;
  }
  if ((bVar11) || (console_batch_mode != true)) {
    __fd_00 = 0;
    __fd = open("/dev/tty",2);
    __s = _stderr;
    if (-1 < __fd) {
      __s = fdopen(__fd,"w");
      __fd_00 = __fd;
    }
    if ((p->name_reqd == true) && (pcVar1 = p->name, pcVar1 != (char *)0x0)) {
      sVar7 = strlen(pcVar1);
      fwrite(pcVar1,1,sVar7,__s);
      fflush(__s);
      whole.len = sVar7;
      whole.ptr = pcVar1;
      suffix.len = 1;
      suffix.ptr = "\n";
      _Var4 = ptrlen_endswith(whole,suffix,(ptrlen *)0x0);
      if (!_Var4) {
        fputc(10,__s);
        fflush(__s);
      }
    }
    pcVar1 = p->instruction;
    if (pcVar1 != (char *)0x0) {
      sVar7 = strlen(pcVar1);
      fwrite(pcVar1,1,sVar7,__s);
      fflush(__s);
      whole_00.len = sVar7;
      whole_00.ptr = pcVar1;
      suffix_00.len = 1;
      suffix_00.ptr = "\n";
      _Var4 = ptrlen_endswith(whole_00,suffix_00,(ptrlen *)0x0);
      if (!_Var4) {
        fputc(10,__s);
        fflush(__s);
      }
    }
    if (p->n_prompts != 0) {
      uVar10 = 0;
      do {
        ppVar2 = p->prompts[uVar10];
        tcgetattr(__fd_00,&local_6c);
        local_a8.c_iflag = local_6c.c_iflag;
        local_a8.c_oflag = local_6c.c_oflag;
        local_a8.c_line = local_6c.c_line;
        local_a8.c_cc[0] = local_6c.c_cc[0];
        local_a8.c_cc[1] = local_6c.c_cc[1];
        local_a8.c_cc[2] = local_6c.c_cc[2];
        local_a8.c_cc[3] = local_6c.c_cc[3];
        local_a8.c_cc[4] = local_6c.c_cc[4];
        local_a8.c_cc[5] = local_6c.c_cc[5];
        local_a8.c_cc[6] = local_6c.c_cc[6];
        local_a8.c_cc[7] = local_6c.c_cc[7];
        local_a8.c_cc[8] = local_6c.c_cc[8];
        local_a8.c_cc[9] = local_6c.c_cc[9];
        local_a8.c_cc[10] = local_6c.c_cc[10];
        local_a8.c_cc[0xb] = local_6c.c_cc[0xb];
        local_a8.c_cc[0xc] = local_6c.c_cc[0xc];
        local_a8.c_cc[0xd] = local_6c.c_cc[0xd];
        local_a8.c_cc[0xe] = local_6c.c_cc[0xe];
        local_a8.c_cc[0xf] = local_6c.c_cc[0xf];
        local_a8.c_cc[0x10] = local_6c.c_cc[0x10];
        local_a8.c_cc[0x11] = local_6c.c_cc[0x11];
        local_a8.c_cc[0x12] = local_6c.c_cc[0x12];
        local_a8.c_cc[0x13] = local_6c.c_cc[0x13];
        local_a8.c_cc[0x14] = local_6c.c_cc[0x14];
        local_a8.c_cc[0x15] = local_6c.c_cc[0x15];
        local_a8.c_cc[0x16] = local_6c.c_cc[0x16];
        local_a8.c_ispeed = local_6c.c_ispeed;
        local_a8.c_ospeed = local_6c.c_ospeed;
        local_a8.c_lflag = local_6c.c_lflag;
        uVar6 = local_a8.c_lflag | 0xb;
        if (ppVar2->echo == false) {
          uVar6 = local_a8.c_lflag & 0xfffffff7 | 3;
        }
        local_a8.c_lflag = uVar6;
        local_a8.c_cflag = local_6c.c_cflag;
        bVar11 = false;
        tcsetattr(__fd_00,0,&local_a8);
        pcVar1 = ppVar2->prompt;
        sVar7 = strlen(pcVar1);
        fwrite(pcVar1,1,sVar7,__s);
        fflush(__s);
        do {
          sVar3 = ppVar2->result->len;
          __buf = strbuf_append(ppVar2->result,0x10000);
          sVar8 = read(__fd_00,__buf,0x10000);
          uVar6 = (uint)sVar8;
          if (uVar6 == 0) {
            __return_storage_ptr__->kind = SPRK_USER_ABORT;
            __return_storage_ptr__->errdata_lit = (char *)0x0;
LAB_00107b6b:
            bVar11 = true;
            bVar5 = false;
          }
          else {
            if ((int)uVar6 < 0) {
              piVar9 = __errno_location();
              make_spr_sw_abort_errno(__return_storage_ptr__,"Error reading from terminal",*piVar9);
              goto LAB_00107b6b;
            }
            strbuf_shrink_to(ppVar2->result,(uVar6 & 0x7fffffff) + sVar3);
            _Var4 = strbuf_chomp(ppVar2->result,'\n');
            bVar5 = !_Var4;
          }
        } while (bVar5);
        tcsetattr(__fd_00,0,&local_6c);
        if (ppVar2->echo == false) {
          fputc(10,__s);
          fflush(__s);
        }
        if (bVar11) {
          if (_stderr == __s) {
            return __return_storage_ptr__;
          }
          fclose(__s);
          return __return_storage_ptr__;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < p->n_prompts);
    }
    if (_stderr != __s) {
      fclose(__s);
    }
    __return_storage_ptr__->kind = SPRK_OK;
    __return_storage_ptr__->errdata_lit = (char *)0x0;
  }
  else {
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Cannot answer interactive prompts in batch mode");
  }
  return __return_storage_ptr__;
}

Assistant:

SeatPromptResult console_get_userpass_input(prompts_t *p)
{
    size_t curr_prompt;
    FILE *outfp = NULL;
    int infd;

    /*
     * Zero all the results, in case we abort half-way through.
     */
    {
        int i;
        for (i = 0; i < p->n_prompts; i++)
            prompt_set_result(p->prompts[i], "");
    }

    if (p->n_prompts && console_batch_mode)
        return SPR_SW_ABORT("Cannot answer interactive prompts "
                            "in batch mode");

    console_open(&outfp, &infd);

    /*
     * Preamble.
     */
    /* We only print the `name' caption if we have to... */
    if (p->name_reqd && p->name) {
        ptrlen plname = ptrlen_from_asciz(p->name);
        console_write(outfp, plname);
        if (!ptrlen_endswith(plname, PTRLEN_LITERAL("\n"), NULL))
            console_write(outfp, PTRLEN_LITERAL("\n"));
    }
    /* ...but we always print any `instruction'. */
    if (p->instruction) {
        ptrlen plinst = ptrlen_from_asciz(p->instruction);
        console_write(outfp, plinst);
        if (!ptrlen_endswith(plinst, PTRLEN_LITERAL("\n"), NULL))
            console_write(outfp, PTRLEN_LITERAL("\n"));
    }

    for (curr_prompt = 0; curr_prompt < p->n_prompts; curr_prompt++) {

        struct termios oldmode, newmode;
        prompt_t *pr = p->prompts[curr_prompt];

        tcgetattr(infd, &oldmode);
        newmode = oldmode;
        newmode.c_lflag |= ISIG | ICANON;
        if (!pr->echo)
            newmode.c_lflag &= ~ECHO;
        else
            newmode.c_lflag |= ECHO;
        tcsetattr(infd, TCSANOW, &newmode);

        console_write(outfp, ptrlen_from_asciz(pr->prompt));

        bool failed = false;
        SeatPromptResult spr;
        while (1) {
            size_t toread = 65536;
            size_t prev_result_len = pr->result->len;
            void *ptr = strbuf_append(pr->result, toread);
            int ret = read(infd, ptr, toread);

            if (ret == 0) {
                /* Regard EOF on the terminal as a deliberate user-abort */
                failed = true;
                spr = SPR_USER_ABORT;
                break;
            }

            if (ret < 0) {
                /* Any other failure to read from the terminal is treated as
                 * an unexpected error and reported to the user. */
                failed = true;
                spr = make_spr_sw_abort_errno(
                    "Error reading from terminal", errno);
                break;
            }

            strbuf_shrink_to(pr->result, prev_result_len + ret);
            if (strbuf_chomp(pr->result, '\n'))
                break;
        }

        tcsetattr(infd, TCSANOW, &oldmode);

        if (!pr->echo)
            console_write(outfp, PTRLEN_LITERAL("\n"));

        if (failed) {
            console_close(outfp, infd);
            return spr;
        }
    }

    console_close(outfp, infd);

    return SPR_OK;
}